

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatest.cpp
# Opt level: O0

bool TestMotorPowerControl(int curLine,AmpIO *Board,BasePort *Port,ofstream *logFile,uint qlaNum)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  uint32_t uVar5;
  int iVar6;
  ostream *poVar7;
  ulong uVar8;
  void *pvVar9;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  bool motorEn_1;
  uint uStack_c0;
  bool motorEn;
  uint motorStart;
  uint i;
  uint32_t fver;
  uint32_t status_goal;
  uint32_t status_mask;
  unsigned_long mask;
  bool ignoreMV;
  ulong uStack_a0;
  bool pass;
  unsigned_long status;
  char buf [100];
  uint qlaNum_local;
  ofstream *logFile_local;
  BasePort *Port_local;
  AmpIO *Board_local;
  int curLine_local;
  
  bVar1 = true;
  bVar2 = false;
  AmpIO::WriteWatchdogPeriod(Board,0);
  poVar7 = (ostream *)std::ostream::operator<<(logFile,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<(poVar7,"=== Motor Power Control ===");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  while( true ) {
    AmpIO::WritePowerEnable(Board,true);
    Amp1394Console::Print(curLine,9,"Enable motor power -");
    Amp1394Console::Refresh();
    Amp1394_Sleep(1.0);
    (*Port->_vptr_BasePort[0x1d])();
    uVar3 = AmpIO::GetStatus(Board);
    uVar8 = (ulong)uVar3;
    poVar7 = std::operator<<((ostream *)logFile,"   Enable motor power: ");
    pvVar9 = (void *)std::ostream::operator<<(poVar7,std::hex);
    std::ostream::operator<<(pvVar9,uVar8);
    if (qlaNum == 1) {
      local_cc = 0x44000;
    }
    else {
      local_cc = 0xc0f0f;
      if (qlaNum == 2) {
        local_cc = 0x48000;
      }
    }
    if (qlaNum == 1) {
      local_d0 = 0x44000;
    }
    else {
      local_d0 = 0xc0000;
      if (qlaNum == 2) {
        local_d0 = 0x48000;
      }
    }
    if ((uVar3 & local_cc) == local_d0) break;
    sprintf((char *)&status,"FAIL (%08lx) - is motor power connected?",uVar8);
    Board_local._4_4_ = curLine + 1;
    Amp1394Console::Print(curLine,0x1e,(char *)&status);
    Amp1394Console::Print(Board_local._4_4_,9,"Do you want to retry (y/n)? ");
    Amp1394Console::GetString((char *)&status,100);
    if (((char)status != 'y') && ((char)status != 'Y')) {
      poVar7 = std::operator<<((ostream *)logFile," - FAIL");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      bVar1 = false;
LAB_001087dc:
      iVar4 = Board_local._4_4_ + 1;
      Amp1394Console::Print(Board_local._4_4_,0x1e,(char *)&status);
      uVar5 = BoardIO::GetFirmwareVersion((BoardIO *)Board);
      if (qlaNum == 1) {
        local_d4 = 0x4000;
      }
      else {
        local_d4 = 0x4ffff;
        if (qlaNum == 2) {
          local_d4 = 0x8000;
        }
      }
      if (qlaNum == 1) {
        local_d8 = 0x4000;
      }
      else {
        local_d8 = 0x40000;
        if (qlaNum == 2) {
          local_d8 = 0x8000;
        }
      }
      if ((bVar1 == false) && ((uVar3 & local_d4) == local_d8)) {
        poVar7 = std::operator<<((ostream *)logFile,
                                 "   Continuing test, ignoring \'motor voltage good\' feedback");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        Amp1394Console::Print(iVar4,9,"Continuing test, ignoring \'motor voltage good\' feedback");
        bVar2 = true;
        iVar4 = Board_local._4_4_ + 2;
      }
      Board_local._4_4_ = iVar4;
      Amp1394Console::Refresh();
      iVar4 = 0;
      if (qlaNum == 2) {
        iVar4 = 4;
      }
      if (uVar5 < 8) {
        AmpIO::WriteAmpEnable(Board,0xf,0xf);
      }
      else {
        for (uStack_c0 = 0; uStack_c0 < 4; uStack_c0 = uStack_c0 + 1) {
          AmpIO::WriteAmpEnableAxis(Board,iVar4 + uStack_c0,true);
        }
      }
      Amp1394_Sleep(0.006);
      (*Port->_vptr_BasePort[0x1d])();
      if (uVar5 < 8) {
        uVar3 = AmpIO::GetStatus(Board);
        uVar8 = (ulong)uVar3;
        poVar7 = std::operator<<((ostream *)logFile,"   Amplifier enable: ");
        pvVar9 = (void *)std::ostream::operator<<(poVar7,std::hex);
        std::ostream::operator<<(pvVar9,uVar8);
        iVar6 = 0xc0f0f;
        if (bVar2) {
          iVar6 = 0x40f0f;
        }
        _status_goal = (ulong)iVar6;
        if ((uVar8 & _status_goal) == _status_goal) {
          poVar7 = std::operator<<((ostream *)logFile," - PASS");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          sprintf((char *)&status,"Enable power amplifiers - PASS (%08lx)",uVar8);
        }
        else {
          poVar7 = std::operator<<((ostream *)logFile," - FAIL");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          sprintf((char *)&status,"Enable power amplifiers - FAIL (%08lx)",uVar8);
          bVar1 = false;
        }
      }
      else {
        std::operator<<((ostream *)logFile,"   Amplifier enable: ");
        uStack_a0 = 0;
        for (uStack_c0 = 0; uStack_c0 < 4; uStack_c0 = uStack_c0 + 1) {
          bVar2 = AmpIO::GetAmpEnable(Board,iVar4 + uStack_c0);
          if (bVar2) {
            std::operator<<((ostream *)logFile,"1 ");
            uStack_a0 = (long)(1 << ((byte)uStack_c0 & 0x1f)) | uStack_a0;
          }
          else {
            std::operator<<((ostream *)logFile,"0 ");
            bVar1 = false;
          }
        }
        if (uStack_a0 == 0xf) {
          poVar7 = std::operator<<((ostream *)logFile," - PASS");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          sprintf((char *)&status,"Enable power amplifiers - PASS (%04lx)",0xf);
        }
        else {
          poVar7 = std::operator<<((ostream *)logFile," - FAIL");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          sprintf((char *)&status,"Enable power amplifiers - FAIL (%04lx)",uStack_a0);
        }
      }
      Amp1394Console::Print(Board_local._4_4_,9,(char *)&status);
      Amp1394Console::Refresh();
      Amp1394_Sleep(1.0);
      if (uVar5 < 8) {
        AmpIO::WriteAmpEnable(Board,0xf,0);
      }
      else {
        for (uStack_c0 = 0; uStack_c0 < 4; uStack_c0 = uStack_c0 + 1) {
          AmpIO::WriteAmpEnableAxis(Board,iVar4 + uStack_c0,false);
        }
      }
      Amp1394_Sleep(0.001);
      (*Port->_vptr_BasePort[0x1d])();
      if (uVar5 < 8) {
        uVar3 = AmpIO::GetStatus(Board);
        uVar8 = (ulong)uVar3;
        poVar7 = std::operator<<((ostream *)logFile,"   Amplifier disable: ");
        pvVar9 = (void *)std::ostream::operator<<(poVar7,std::hex);
        std::ostream::operator<<(pvVar9,uVar8);
        if ((uVar8 & _status_goal) == (_status_goal & 0xc0000)) {
          poVar7 = std::operator<<((ostream *)logFile," - PASS");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          sprintf((char *)&status,"Disable power amplifiers - PASS (%08lx)",uVar8);
        }
        else {
          poVar7 = std::operator<<((ostream *)logFile," - FAIL");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          sprintf((char *)&status,"Disable power amplifiers - FAIL (%08lx)",uVar8);
          bVar1 = false;
        }
      }
      else {
        std::operator<<((ostream *)logFile,"   Amplifier disable: ");
        uStack_a0 = 0;
        for (uStack_c0 = 0; uStack_c0 < 4; uStack_c0 = uStack_c0 + 1) {
          bVar2 = AmpIO::GetAmpEnable(Board,iVar4 + uStack_c0);
          if (bVar2) {
            std::operator<<((ostream *)logFile,"1 ");
            uStack_a0 = (long)(1 << ((byte)uStack_c0 & 0x1f)) | uStack_a0;
            bVar1 = false;
          }
          else {
            std::operator<<((ostream *)logFile,"0 ");
          }
        }
        if (uStack_a0 == 0) {
          poVar7 = std::operator<<((ostream *)logFile," - PASS");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          sprintf((char *)&status,"Disable power amplifiers - PASS (%04lx)",0);
        }
        else {
          poVar7 = std::operator<<((ostream *)logFile," - FAIL");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          sprintf((char *)&status,"Disable power amplifiers - FAIL (%04lx)",uStack_a0);
        }
      }
      Amp1394Console::Print(Board_local._4_4_ + 1,9,(char *)&status);
      AmpIO::WritePowerEnable(Board,false);
      Amp1394Console::Print(Board_local._4_4_ + 2,9,"Disable motor power -");
      Amp1394Console::Refresh();
      Amp1394_Sleep(1.0);
      (*Port->_vptr_BasePort[0x1d])();
      uVar3 = AmpIO::GetStatus(Board);
      uVar8 = (ulong)uVar3;
      poVar7 = std::operator<<((ostream *)logFile,"   Disable motor power: ");
      pvVar9 = (void *)std::ostream::operator<<(poVar7,std::hex);
      std::ostream::operator<<(pvVar9,uVar8);
      if (qlaNum == 1) {
        local_dc = 0x44000;
      }
      else {
        local_dc = 0xc0f0f;
        if (qlaNum == 2) {
          local_dc = 0x48000;
        }
      }
      if ((uVar3 & local_dc) == 0) {
        poVar7 = std::operator<<((ostream *)logFile," - PASS");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        sprintf((char *)&status,"PASS (%08lx)",uVar8);
      }
      else {
        poVar7 = std::operator<<((ostream *)logFile," - FAIL");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        sprintf((char *)&status,"FAIL (%08lx)",uVar8);
        bVar1 = false;
      }
      Amp1394Console::Print(Board_local._4_4_ + 2,0x1f,(char *)&status);
      if (qlaNum == 0) {
        AmpIO::WriteSafetyRelay(Board,true);
        Amp1394_Sleep(0.01);
        poVar7 = std::operator<<((ostream *)logFile,"   Enable safety relay: ");
        pvVar9 = (void *)std::ostream::operator<<(poVar7,std::hex);
        uVar3 = BoardIO::ReadStatus((BoardIO *)Board);
        std::ostream::operator<<(pvVar9,uVar3);
        bVar2 = AmpIO::ReadSafetyRelayStatus(Board);
        if (bVar2) {
          poVar7 = std::operator<<((ostream *)logFile," - PASS");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          uVar3 = BoardIO::ReadStatus((BoardIO *)Board);
          sprintf((char *)&status,"Enable safety relay - PASS (%08x)",(ulong)uVar3);
        }
        else {
          poVar7 = std::operator<<((ostream *)logFile," - FAIL");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          uVar3 = BoardIO::ReadStatus((BoardIO *)Board);
          sprintf((char *)&status,"Enable safety relay - FAIL (%08x)",(ulong)uVar3);
          bVar1 = false;
        }
        Amp1394Console::Print(Board_local._4_4_ + 3,9,(char *)&status);
        Amp1394Console::Refresh();
        Amp1394_Sleep(1.0);
        AmpIO::WriteSafetyRelay(Board,false);
        Amp1394_Sleep(0.001);
        (*Port->_vptr_BasePort[0x1d])();
        uVar3 = AmpIO::GetStatus(Board);
        uVar8 = (ulong)uVar3;
        poVar7 = std::operator<<((ostream *)logFile,"   Disable safety relay: ");
        pvVar9 = (void *)std::ostream::operator<<(poVar7,std::hex);
        std::ostream::operator<<(pvVar9,uVar8);
        if ((uVar3 & 0x30000) == 0) {
          poVar7 = std::operator<<((ostream *)logFile," - PASS");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          sprintf((char *)&status,"Disable safety relay - PASS (%08lx)",uVar8);
        }
        else {
          poVar7 = std::operator<<((ostream *)logFile," - FAIL");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          sprintf((char *)&status,"Disable safety relay - FAIL (%08lx)",uVar8);
          bVar1 = false;
        }
        Amp1394Console::Print(Board_local._4_4_ + 4,9,(char *)&status);
      }
      else {
        poVar7 = std::operator<<((ostream *)logFile,"   Skipping safety relay tests for DQLA");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      }
      AmpIO::WriteWatchdogPeriod(Board,0xffff);
      return bVar1;
    }
    Amp1394Console::Print(Board_local._4_4_,9,"                               ");
    Amp1394Console::Print(curLine,0x1e,"                                           ");
    poVar7 = std::operator<<((ostream *)logFile," - Retrying");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  }
  poVar7 = std::operator<<((ostream *)logFile," - PASS");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  sprintf((char *)&status,"PASS (%08lx)",uVar8);
  Board_local._4_4_ = curLine;
  goto LAB_001087dc;
}

Assistant:

bool TestMotorPowerControl(int curLine, AmpIO &Board, BasePort *Port, std::ofstream &logFile, unsigned int qlaNum)
{
    char buf[100];
    unsigned long status;
    bool pass = true;
    bool ignoreMV = false;     // ignore "motor voltage good" feedback
    unsigned long mask;

    // Disable watchdog
    Board.WriteWatchdogPeriod(0x0000);

    logFile << std::endl << "=== Motor Power Control ===" << std::endl;
 retry:
    // Enabling motor power supply
    Board.WritePowerEnable(true);
    Amp1394Console::Print(curLine, 9, "Enable motor power -");
    Amp1394Console::Refresh();
    Amp1394_Sleep(1.0);
    Port->ReadAllBoards();
    status = Board.GetStatus();
    logFile << "   Enable motor power: " << std::hex << status;
    // Note: QLA implementation also verifies that amp enable is off
    uint32_t status_mask = (qlaNum == 1) ? 0x00044000 : (qlaNum == 2) ? 0x00048000 : 0x000c0f0f;
    uint32_t status_goal = (qlaNum == 1) ? 0x00044000 : (qlaNum == 2) ? 0x00048000 : 0x000c0000;
    if ((status & status_mask) != status_goal) {
        sprintf(buf, "FAIL (%08lx) - is motor power connected?", status);
        Amp1394Console::Print(curLine++, 30, buf);
        Amp1394Console::Print(curLine, 9, "Do you want to retry (y/n)? ");
        Amp1394Console::GetString(buf, sizeof(buf));
        if ((buf[0] == 'y') || (buf[0] == 'Y')) {
            Amp1394Console::Print(curLine, 9, "                               ");
            curLine -= 1;
            Amp1394Console::Print(curLine, 30, "                                           ");
            logFile << " - Retrying" << std::endl;
            goto retry;
        }
        logFile << " - FAIL" << std::endl;
        pass = false;
    }
    else {
        logFile << " - PASS" << std::endl;
        sprintf(buf, "PASS (%08lx)", status);
    }
    Amp1394Console::Print(curLine++, 30, buf);

    uint32_t fver = Board.GetFirmwareVersion();

    status_mask = (qlaNum == 1) ? 0x00004000 : (qlaNum == 2) ? 0x00008000 : 0x0004ffff;
    status_goal = (qlaNum == 1) ? 0x00004000 : (qlaNum == 2) ? 0x00008000 : 0x00040000;
    if (!pass && (status & status_mask) == status_goal) {
        logFile << "   Continuing test, ignoring 'motor voltage good' feedback" << std::endl;
        Amp1394Console::Print(curLine++, 9, "Continuing test, ignoring 'motor voltage good' feedback");
        ignoreMV = true;
    }
    Amp1394Console::Refresh();

    unsigned int i;
    unsigned int motorStart = (qlaNum == 2) ? 4 : 0;

    // Enabling individual amplifiers
    if (fver < 8) {
        Board.WriteAmpEnable(0x0f, 0x0f);
    }
    else {
        for (i = 0; i < 4; i++)
            Board.WriteAmpEnableAxis(motorStart+i, true);
    }
    Amp1394_Sleep(0.006);       // QLA Rev 1.5+ may have delay up to 5.3 ms
    Port->ReadAllBoards();
    if (fver < 8) {
        status = Board.GetStatus();
        logFile << "   Amplifier enable: " << std::hex << status;
        mask = ignoreMV ? 0x00040f0f : 0x000c0f0f;
        if ((status&mask) != (0x000c0f0f&mask)) {
            logFile << " - FAIL" << std::endl;
            sprintf(buf, "Enable power amplifiers - FAIL (%08lx)", status);
            pass = false;
        }
        else {
            logFile << " - PASS" << std::endl;
            sprintf(buf, "Enable power amplifiers - PASS (%08lx)", status);
        }
    }
    else {
        logFile << "   Amplifier enable: ";
        status = 0;
        for (i = 0; i < 4; i++) {
            bool motorEn = Board.GetAmpEnable(motorStart+i);
            if (motorEn) {
                logFile << "1 ";
                status |= (1 << i);
            }
            else {
                logFile << "0 ";
                pass = false;
            }
        }
        if (status != 0x000f) {
            logFile << " - FAIL" << std::endl;
            sprintf(buf, "Enable power amplifiers - FAIL (%04lx)", status);
        }
        else {
            logFile << " - PASS" << std::endl;
            sprintf(buf, "Enable power amplifiers - PASS (%04lx)", status);
        }
    }
    Amp1394Console::Print(curLine++, 9, buf);

    Amp1394Console::Refresh();
    Amp1394_Sleep(1.0);    // wait 1 second (LEDs should be ON)

    // Turning amplifiers off
    if (fver < 8) {
        Board.WriteAmpEnable(0x0f, 0);
    }
    else {
        for (i = 0; i < 4; i++)
            Board.WriteAmpEnableAxis(motorStart+i, false);
    }
    Amp1394_Sleep(0.001);
    Port->ReadAllBoards();
    if (fver < 8) {
        status = Board.GetStatus();
        logFile << "   Amplifier disable: " << std::hex << status;
        if ((status&mask) != (0x000c0000&mask)) {
            logFile << " - FAIL" << std::endl;
            sprintf(buf, "Disable power amplifiers - FAIL (%08lx)", status);
            pass = false;
        }
        else {
            logFile << " - PASS" << std::endl;
            sprintf(buf, "Disable power amplifiers - PASS (%08lx)", status);
        }
    }
    else {
        logFile << "   Amplifier disable: ";
        status = 0;
        for (i = 0; i < 4; i++) {
            bool motorEn = Board.GetAmpEnable(motorStart+i);
            if (motorEn) {
                logFile << "1 ";
                status |= (1 << i);
                pass = false;
            }
            else {
                logFile << "0 ";
            }
        }
        if (status != 0) {
            logFile << " - FAIL" << std::endl;
            sprintf(buf, "Disable power amplifiers - FAIL (%04lx)", status);
        }
        else {
            logFile << " - PASS" << std::endl;
            sprintf(buf, "Disable power amplifiers - PASS (%04lx)", status);
        }
    }
    Amp1394Console::Print(curLine++, 9, buf);

    Board.WritePowerEnable(false);
    Amp1394Console::Print(curLine, 9, "Disable motor power -");
    Amp1394Console::Refresh();
    Amp1394_Sleep(1.0);
    Port->ReadAllBoards();
    status = Board.GetStatus();
    logFile << "   Disable motor power: " << std::hex << status;
    status_mask = (qlaNum == 1) ? 0x00044000 : (qlaNum == 2) ? 0x00048000 : 0x000c0f0f;
    if ((status&status_mask) != 0) {
        logFile << " - FAIL" << std::endl;
        sprintf(buf, "FAIL (%08lx)", status);
        pass = false;
    }
    else {
        logFile << " - PASS" << std::endl;
        sprintf(buf, "PASS (%08lx)", status);
    }
    Amp1394Console::Print(curLine++, 31, buf);

    if (qlaNum == 0) {
        // Turn on safety relay
        Board.WriteSafetyRelay(true);
        Amp1394_Sleep(0.01);   // 10 ms
        logFile << "   Enable safety relay: " << std::hex << Board.ReadStatus();
        if (!Board.ReadSafetyRelayStatus()) {
            logFile << " - FAIL" << std::endl;
            // Old QLA boards (before Rev 1.3) require +12V to be connected to relay
            sprintf(buf, "Enable safety relay - FAIL (%08x)", Board.ReadStatus());
            pass = false;
        }
        else {
            logFile << " - PASS" << std::endl;
            sprintf(buf, "Enable safety relay - PASS (%08x)", Board.ReadStatus());
        }
        Amp1394Console::Print(curLine++, 9, buf);

        Amp1394Console::Refresh();
        Amp1394_Sleep(1.0);

        // Turn off safety relay
        Board.WriteSafetyRelay(false);
        Amp1394_Sleep(0.001);
        Port->ReadAllBoards();
        status = Board.GetStatus();
        logFile << "   Disable safety relay: " << std::hex << status;
        if ((status&0x00030000) != 0) {
            logFile << " - FAIL" << std::endl;
            sprintf(buf, "Disable safety relay - FAIL (%08lx)", status);
            pass = false;
        }
        else {
            logFile << " - PASS" << std::endl;
            sprintf(buf, "Disable safety relay - PASS (%08lx)", status);
        }
        Amp1394Console::Print(curLine++, 9, buf);
    }
    else {
        logFile << "   Skipping safety relay tests for DQLA" << std::endl;
    }

    // Reenable watchdog
    Board.WriteWatchdogPeriod(0xFFFF);

    return pass;
}